

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void ifftrecurs(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  long lVar1;
  
  if (0xb < (ulong)M) {
    lVar1 = 0;
    do {
      ifftrecurs(ioptr + (lVar1 << (M - 3U & 0x3f)) * 2,M - 3U,Utbl,Ustride * 8,NDiffU,StageCnt + -1
                );
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    NDiffU = 1L << ((ulong)((int)M - 3) & 0x3f);
    StageCnt = 1;
  }
  ibfstages(ioptr,M,Utbl,Ustride,NDiffU,StageCnt);
  return;
}

Assistant:

void ifftrecurs(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt){
/* recursive bfstages calls to maximize on chip cache efficiency */
long i1;
if (M <= MCACHE)
	ibfstages(ioptr, M, Utbl, Ustride, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
else{
	for (i1=0; i1<8; i1++){
		ifftrecurs(&ioptr[i1*POW2(M-3)*2], M-3, Utbl, 8*Ustride, NDiffU, StageCnt-1);	/*  RADIX 8 Stages	*/
	}
	ibfstages(ioptr, M, Utbl, Ustride, POW2(M-3), 1);	/*  RADIX 8 Stage	*/
}
}